

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeHulls.cpp
# Opt level: O1

void __thiscall
HACD::ChUll::ChUll(ChUll *this,HaU32 vcount,HaF32 *vertices,HaU32 tcount,HaU32 *indices,HaU32 guid)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  HaF32 *vertices_00;
  HaU32 *indices_00;
  int iVar8;
  float *pfVar9;
  HaF32 HVar10;
  HaF32 HVar11;
  undefined1 auVar12 [16];
  HaF32 HVar13;
  undefined1 auVar14 [16];
  HaF32 HVar15;
  HaF32 HVar16;
  HaF32 HVar17;
  
  this->mGuid = guid;
  this->mVertexCount = vcount;
  this->mTriangleCount = tcount;
  vertices_00 = (HaF32 *)malloc((ulong)vcount * 0xc);
  this->mVertices = vertices_00;
  memcpy(vertices_00,vertices,(ulong)vcount * 0xc);
  indices_00 = (HaU32 *)malloc((ulong)tcount * 0xc);
  this->mIndices = indices_00;
  memcpy(indices_00,indices,(ulong)tcount * 0xc);
  HVar10 = fm_computeMeshVolume(vertices_00,tcount,indices_00);
  this->mVolume = HVar10;
  HVar10 = *vertices_00;
  this->mMin[0] = HVar10;
  HVar11 = vertices_00[1];
  this->mMin[1] = HVar11;
  HVar13 = vertices_00[2];
  this->mMin[2] = HVar13;
  this->mMax[0] = HVar10;
  this->mMax[1] = HVar11;
  this->mMax[2] = HVar13;
  if (1 < vcount) {
    HVar10 = this->mMin[0];
    HVar11 = this->mMin[1];
    HVar13 = this->mMin[2];
    HVar15 = this->mMax[0];
    HVar16 = this->mMax[1];
    HVar17 = this->mMax[2];
    pfVar9 = (float *)(vertices_00 + 5);
    iVar8 = vcount - 1;
    do {
      fVar1 = pfVar9[-2];
      if (fVar1 < (float)HVar10) {
        this->mMin[0] = (HaF32)fVar1;
        HVar10 = (HaF32)fVar1;
      }
      fVar2 = pfVar9[-1];
      if (fVar2 < (float)HVar11) {
        this->mMin[1] = (HaF32)fVar2;
        HVar11 = (HaF32)fVar2;
      }
      fVar3 = *pfVar9;
      if (fVar3 < (float)HVar13) {
        this->mMin[2] = (HaF32)fVar3;
        HVar13 = (HaF32)fVar3;
      }
      if ((float)HVar15 < fVar1) {
        this->mMax[0] = (HaF32)fVar1;
        HVar15 = (HaF32)fVar1;
      }
      if ((float)HVar16 < fVar2) {
        this->mMax[1] = (HaF32)fVar2;
        HVar16 = (HaF32)fVar2;
      }
      if ((float)HVar17 < fVar3) {
        this->mMax[2] = (HaF32)fVar3;
        HVar17 = (HaF32)fVar3;
      }
      pfVar9 = pfVar9 + 3;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  fVar1 = (float)this->mMax[1] - (float)this->mMin[1];
  auVar14 = ZEXT416((uint)((float)this->mMax[0] - (float)this->mMin[0]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar14,auVar14);
  auVar12 = ZEXT416((uint)((float)this->mMax[2] - (float)this->mMin[2]));
  auVar14 = vfmadd231ss_fma(auVar14,auVar12,auVar12);
  if (auVar14._0_4_ < 0.0) {
    HVar10 = (HaF32)sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    HVar10 = auVar14._0_4_;
  }
  this->mDiagonal = HVar10;
  fVar1 = (float)this->mMax[0];
  fVar2 = (float)this->mMax[1];
  fVar3 = (float)this->mMax[2];
  fVar4 = (float)this->mMin[2];
  fVar5 = (fVar1 - (float)this->mMin[0]) * 0.1;
  fVar6 = (fVar2 - (float)this->mMin[1]) * 0.1;
  fVar7 = (fVar3 - fVar4) * 0.1;
  this->mMin[0] = (HaF32)((float)this->mMin[0] - fVar5);
  this->mMin[1] = (HaF32)((float)this->mMin[1] - fVar6);
  this->mMin[2] = (HaF32)(fVar4 - fVar7);
  this->mMax[0] = (HaF32)(fVar1 + fVar5);
  this->mMax[1] = (HaF32)(fVar2 + fVar6);
  this->mMax[2] = (HaF32)(fVar7 + fVar3);
  return;
}

Assistant:

ChUll(HaU32 vcount,const HaF32 *vertices,HaU32 tcount,const HaU32 *indices,HaU32 guid)
		{
			mGuid = guid;
			mVertexCount = vcount;
			mTriangleCount = tcount;
			mVertices = (HaF32 *)HACD_ALLOC(sizeof(HaF32)*3*vcount);
			memcpy(mVertices,vertices,sizeof(HaF32)*3*vcount);
			mIndices = (HaU32 *)HACD_ALLOC(sizeof(HaU32)*3*tcount);
			memcpy(mIndices,indices,sizeof(HaU32)*3*tcount);
			mVolume = fm_computeMeshVolume( mVertices, mTriangleCount, mIndices);
			mDiagonal = fm_computeBestFitAABB( mVertexCount, mVertices, sizeof(hacd::HaF32)*3, mMin, mMax );
			hacd::HaF32 dx = mMax[0] - mMin[0];
			hacd::HaF32 dy = mMax[1] - mMin[1];
			hacd::HaF32 dz = mMax[2] - mMin[2];
			dx*=0.1f; // inflate 1/10th on each edge
			dy*=0.1f; // inflate 1/10th on each edge
			dz*=0.1f; // inflate 1/10th on each edge
			mMin[0]-=dx;
			mMin[1]-=dy;
			mMin[2]-=dz;
			mMax[0]+=dx;
			mMax[1]+=dy;
			mMax[2]+=dz;
		}